

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setOptionValue(void *highs,char *option,char *value)

{
  HighsStatus HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Highs_setOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"Highs_setStringOptionValue",&local_5a);
  Highs::deprecationMessage((Highs *)highs,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,option,&local_59);
  std::__cxx11::string::string((string *)&local_58,value,&local_5a);
  HVar1 = Highs::setOptionValue((Highs *)highs,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_setOptionValue(void* highs, const char* option,
                              const char* value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setOptionValue",
                           "Highs_setStringOptionValue");
  return (HighsInt)((Highs*)highs)
      ->setOptionValue(std::string(option), std::string(value));
}